

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O0

void __thiscall pg::SSPMSolver::stream_pm(SSPMSolver *this,ostream *out,int idx)

{
  ostream *this_00;
  bool bVar1;
  undefined1 local_40 [28];
  int c;
  int i;
  int j;
  int base;
  int idx_local;
  ostream *out_local;
  SSPMSolver *this_local;
  
  i = idx * this->l;
  j = idx;
  _base = out;
  out_local = (ostream *)this;
  if (this->pm_d[i] == -1) {
    std::operator<<(out," \x1b[1;33mTop\x1b[m");
  }
  else {
    std::operator<<(out," { ");
    c = 0;
    for (local_40._24_4_ = 0; (int)local_40._24_4_ < this->h; local_40._24_4_ = local_40._24_4_ + 1)
    {
      if (0 < (int)local_40._24_4_) {
        std::operator<<(_base,",");
      }
      local_40._20_4_ = 0;
      while( true ) {
        this_00 = _base;
        bVar1 = false;
        if (c < this->l) {
          bVar1 = this->pm_d[i + c] == local_40._24_4_;
        }
        if (!bVar1) break;
        local_40._20_4_ = local_40._20_4_ + 1;
        bitset::operator[]((bitset *)local_40,(size_t)&this->pm_b);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_40);
        std::ostream::operator<<(this_00,bVar1);
        c = c + 1;
      }
      if (local_40._20_4_ == 0) {
        std::operator<<(_base,anon_var_dwarf_1b3ff9);
      }
    }
    std::operator<<(_base," }");
  }
  return;
}

Assistant:

void
SSPMSolver::stream_pm(std::ostream &out, int idx)
{
    int base = idx*l;
    if (pm_d[base] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and pm_d[base+j] == i) {
                c++;
                out << pm_b[base+j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";
    }
}